

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int32_t __thiscall icu_63::UnicodeSet::hashCode(UnicodeSet *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = this->len;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 * 0xf4243 + this->list[uVar2];
  }
  return uVar1;
}

Assistant:

int32_t UnicodeSet::hashCode(void) const {
    uint32_t result = static_cast<uint32_t>(len);
    for (int32_t i = 0; i < len; ++i) {
        result *= 1000003u;
        result += list[i];
    }
    return static_cast<int32_t>(result);
}